

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcore.cpp
# Opt level: O0

double baryonyx::compute_solution_impl
                 (raw_problem *pb,vector<signed_char,_std::allocator<signed_char>_> *variable_value)

{
  double dVar1;
  char cVar2;
  bool bVar3;
  reference poVar4;
  vector<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
  *this;
  reference poVar5;
  const_reference pvVar6;
  undefined8 uVar9;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  objective_quadratic_element *elem_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
  *__range1_1;
  objective_function_element *elem;
  const_iterator __end1;
  const_iterator __begin1;
  vector<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
  *__range1;
  double ret;
  vector<signed_char,_std::allocator<signed_char>_> *variable_value_local;
  raw_problem *pb_local;
  
  bVar3 = std::vector<signed_char,_std::allocator<signed_char>_>::empty(variable_value);
  if (((bVar3 ^ 0xffU) & 1) == 0) {
    details::fail_fast("Precondition","!variable_value.empty()",
                       "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/lpcore.cpp"
                       ,"189");
  }
  __range1 = (vector<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
              *)(pb->objective).value;
  __end1 = std::
           vector<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
           ::begin(&(pb->objective).elements);
  elem = (objective_function_element *)
         std::
         vector<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
         ::end(&(pb->objective).elements);
  while( true ) {
    bVar3 = __gnu_cxx::
            operator==<const_baryonyx::objective_function_element_*,_std::vector<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>_>
                      (&__end1,(__normal_iterator<const_baryonyx::objective_function_element_*,_std::vector<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>_>
                                *)&elem);
    if (((bVar3 ^ 0xffU) & 1) == 0) break;
    poVar4 = __gnu_cxx::
             __normal_iterator<const_baryonyx::objective_function_element_*,_std::vector<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>_>
             ::operator*(&__end1);
    dVar1 = poVar4->factor;
    uVar9 = 0;
    pvVar6 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                       (variable_value,(long)poVar4->variable_index);
    auVar10._8_8_ = 0;
    auVar10._0_8_ = dVar1;
    auVar7._0_8_ = (double)(int)*pvVar6;
    auVar7._8_8_ = uVar9;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = __range1;
    auVar7 = vfmadd213sd_fma(auVar7,auVar10,auVar12);
    __range1 = auVar7._0_8_;
    __gnu_cxx::
    __normal_iterator<const_baryonyx::objective_function_element_*,_std::vector<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>_>
    ::operator++(&__end1);
  }
  this = &(pb->objective).qelements;
  __end1_1 = std::
             vector<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
             ::begin(this);
  elem_1 = (objective_quadratic_element *)
           std::
           vector<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
           ::end(this);
  while( true ) {
    bVar3 = __gnu_cxx::
            operator==<const_baryonyx::objective_quadratic_element_*,_std::vector<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>_>
                      (&__end1_1,
                       (__normal_iterator<const_baryonyx::objective_quadratic_element_*,_std::vector<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>_>
                        *)&elem_1);
    if (((bVar3 ^ 0xffU) & 1) == 0) break;
    poVar5 = __gnu_cxx::
             __normal_iterator<const_baryonyx::objective_quadratic_element_*,_std::vector<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>_>
             ::operator*(&__end1_1);
    dVar1 = poVar5->factor;
    pvVar6 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                       (variable_value,(long)poVar5->variable_index_a);
    cVar2 = *pvVar6;
    uVar9 = 0;
    pvVar6 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                       (variable_value,(long)poVar5->variable_index_b);
    auVar11._8_8_ = 0;
    auVar11._0_8_ = dVar1 * (double)(int)cVar2;
    auVar8._0_8_ = (double)(int)*pvVar6;
    auVar8._8_8_ = uVar9;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = __range1;
    auVar7 = vfmadd213sd_fma(auVar8,auVar11,auVar13);
    __range1 = auVar7._0_8_;
    __gnu_cxx::
    __normal_iterator<const_baryonyx::objective_quadratic_element_*,_std::vector<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>_>
    ::operator++(&__end1_1);
  }
  return (double)__range1;
}

Assistant:

static double
compute_solution_impl(const raw_problem& pb,
                      const std::vector<var_value>& variable_value)
{
    bx_expects(!variable_value.empty());

    double ret = pb.objective.value;

    for (auto& elem : pb.objective.elements)
        ret += elem.factor * variable_value[elem.variable_index];

    for (auto& elem : pb.objective.qelements)
        ret += elem.factor * variable_value[elem.variable_index_a] *
               variable_value[elem.variable_index_b];

    return ret;
}